

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O1

void __thiscall
TypeTest_ForwardReferencedChild_Test::TestBody(TypeTest_ForwardReferencedChild_Test *this)

{
  undefined1 auVar1 [8];
  Nullability NVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  unsigned_long *lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AssertionResult *this_00;
  char *pcVar5;
  char *in_R9;
  pointer *__ptr;
  bool bVar6;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  undefined1 auStack_88 [8];
  BuildResult result;
  TypeBuilder local_60;
  TypeBuilder builder;
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  
  ::wasm::TypeBuilder::TypeBuilder(&local_60,3);
  ::wasm::TypeBuilder::createRecGroup((ulong)&local_60,0);
  NVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_60);
  uVar3 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_60,NVar2,Exact);
  NVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_60);
  uVar4 = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_60,NVar2,Exact);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l._M_len = 1;
  __l._M_array = (iterator)local_38;
  local_38 = (undefined1  [8])uVar3;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l,
             (allocator_type *)&gtest_ar_.message_);
  auStack_88 = (undefined1  [8])
               builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       gtest_ar._0_8_;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x0);
  if (auStack_88 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_88,
                    result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_88);
  }
  if (builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
       )0x0) {
    operator_delete((void *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl -
                    (long)builder.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  }
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_38;
  local_38 = (undefined1  [8])uVar4;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l_00,
             (allocator_type *)&gtest_ar_.message_);
  auStack_88 = (undefined1  [8])
               builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       gtest_ar._0_8_;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x1);
  if (auStack_88 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_88,
                    result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_88);
  }
  if (builder.impl._M_t.
      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
      _M_t.
      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
      (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
       )0x0) {
    operator_delete((void *)builder.impl._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                    (long)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl -
                    (long)builder.impl._M_t.
                          super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                          .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  }
  auStack_88 = (undefined1  [8])0x0;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ = 0
  ;
  ::wasm::TypeBuilder::setHeapType((ulong)&local_60,(Struct *)0x2);
  if (auStack_88 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_88,
                    result.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_88);
  }
  ::wasm::TypeBuilder::build();
  this_00 = &gtest_ar_;
  local_38[0] = result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u._M_first._M_storage._M_storage[0x10] != '\0';
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_38,(AssertionResult *)"result","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x13e,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &gtest_ar.message_) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  auVar1 = local_38;
  bVar6 = result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] == '\x01';
  lhs = (unsigned_long *)0x0;
  if (bVar6) {
    lhs = (unsigned_long *)auStack_88;
  }
  local_38[0] = bVar6;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar6) {
    local_38._4_4_ = auVar1._4_4_;
    local_38._0_4_ = 3;
    testing::internal::CmpHelperEQ<wasm::TypeBuilder::ErrorReason,wasm::TypeBuilder::ErrorReason>
              ((internal *)&builder,"error->reason",
               "TypeBuilder::ErrorReason::ForwardChildReference",(ErrorReason *)&result,
               (ErrorReason *)local_38);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x142,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_38 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    local_38._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&builder,"error->index","1u",lhs,(uint *)local_38);
    if ((char)builder.impl._M_t.
              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)local_38);
      if (gtest_ar._0_8_ == 0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x143,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      if (local_38 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_38 + 8))();
      }
    }
    if (gtest_ar._0_8_ == 0) goto LAB_001df991;
    this_00 = &gtest_ar;
    __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_;
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)local_38,(AssertionResult *)0x27d3dd,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x141,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &result.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index);
    if (builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
        (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
        &gtest_ar.message_) {
      operator_delete((void *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar_.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar_._0_8_;
    if (gtest_ar_._0_8_ == 0) goto LAB_001df991;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,__ptr_00);
LAB_001df991:
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [result.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
     _M_first._M_storage._M_storage[0x10]]._M_data)
            ((anon_class_1_0_00000001 *)&builder,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)auStack_88);
  ::wasm::TypeBuilder::~TypeBuilder(&local_60);
  return;
}

Assistant:

TEST_F(TypeTest, ForwardReferencedChild) {
  TypeBuilder builder(3);
  builder.createRecGroup(0, 2);
  Type refA1 = builder.getTempRefType(builder[1], Nullable);
  Type refB0 = builder.getTempRefType(builder[2], Nullable);
  // Forward reference to same group is ok.
  builder[0] = Struct({Field(refA1, Mutable)});
  // Forward reference to different group is not ok.
  builder[1] = Struct({Field(refB0, Mutable)});
  builder[2] = Struct{};

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::ForwardChildReference);
  EXPECT_EQ(error->index, 1u);
}